

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualSlackViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  int iVar1;
  int iVar2;
  int __c;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  viol;
  int col;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rowvec;
  int row;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  slacks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  undefined1 *in_stack_fffffffffffffd28;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffd30;
  self_type *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  uint uVar3;
  undefined1 local_29c [80];
  undefined1 local_24c [28];
  double in_stack_fffffffffffffdd0;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffdd8;
  self_type local_1fc;
  uint local_1ac;
  undefined8 local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a0;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_150;
  int local_148;
  undefined1 local_138 [24];
  undefined1 local_120 [24];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e0;
  undefined8 *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined8 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  cpp_dec_float<100U,_int,_void> *local_a0;
  self_type *local_98;
  self_type *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  cpp_dec_float<100U,_int,_void> *local_80;
  self_type *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_100 = 0;
  local_58 = &local_100;
  local_f8 = in_RDX;
  local_f0 = in_RSI;
  local_48 = local_58;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  local_108 = 0;
  local_68 = local_f8;
  local_70 = &local_108;
  local_60 = local_70;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x4d4bb0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x4d4bc9);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  (**(code **)(*in_RDI + 0x300))(in_RDI,local_120);
  (**(code **)(*in_RDI + 0x308))(in_RDI,local_138);
  for (local_148 = 0; iVar2 = local_148,
      iVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x4d4c38), iVar2 < iVar1; local_148 = local_148 + 1) {
    local_150 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rowVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                            in_stack_fffffffffffffd1c);
    local_1a8 = 0;
    local_d0 = &local_1a0;
    local_d8 = &local_1a8;
    local_e0 = 0;
    local_b8 = local_d8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffd30,(double)in_stack_fffffffffffffd28,
               (type *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    local_1ac = 0;
    while (uVar3 = local_1ac,
          iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(local_150), (int)uVar3 < iVar2) {
      in_stack_fffffffffffffd30 =
           &SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::value(local_150,local_1ac)->m_backend;
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::index(local_150,(char *)(ulong)local_1ac,__c);
      local_a8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                              in_stack_fffffffffffffd1c);
      in_stack_fffffffffffffd38 = &local_1fc;
      local_a0 = in_stack_fffffffffffffd30;
      local_98 = in_stack_fffffffffffffd38;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_a9,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffd30,local_a8);
      local_90 = in_stack_fffffffffffffd38;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
      local_80 = local_a0;
      local_88 = local_a8;
      local_78 = in_stack_fffffffffffffd38;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (cpp_dec_float<100U,_int,_void> *)0x4d4df4);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(uVar3,in_stack_fffffffffffffd40),in_stack_fffffffffffffd38);
      local_1ac = local_1ac + 1;
    }
    local_38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                            in_stack_fffffffffffffd1c);
    in_stack_fffffffffffffd28 = local_29c;
    local_30 = &local_1a0;
    local_28 = in_stack_fffffffffffffd28;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_30,local_38);
    local_20 = in_stack_fffffffffffffd28;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    local_10 = local_30;
    local_18 = local_38;
    local_8 = in_stack_fffffffffffffd28;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
               (cpp_dec_float<100U,_int,_void> *)0x4d4f25);
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    in_stack_fffffffffffffd27 =
         boost::multiprecision::operator>
                   ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)0x4d4f52);
    if ((bool)in_stack_fffffffffffffd27) {
      local_c0 = local_f0;
      local_c8 = local_24c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(uVar3,in_stack_fffffffffffffd40),in_stack_fffffffffffffd38);
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x4d4fd3);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x4d4fe0);
  return;
}

Assistant:

void SPxSolverBase<R>::qualSlackViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());
   VectorBase<R> slacks(this->nRows());

   getPrimalSol(solu);
   getSlacks(slacks);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = spxAbs(val - slacks[row]);

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}